

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.cpp
# Opt level: O2

void __thiscall ki::protocol::dml::MessageHeader::read_from(MessageHeader *this,istream *istream)

{
  Field<unsigned_char> *pFVar1;
  Field<unsigned_char> *pFVar2;
  Field<unsigned_short> *pFVar3;
  string sStack_278;
  string local_258;
  string local_238 [2];
  Record record;
  ostringstream oss;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)local_238,"m_service_id",(allocator *)&oss);
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(&record,local_238,true);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::string((string *)&local_258,"m_type",(allocator *)&oss);
  pFVar2 = ki::dml::Record::add_field<unsigned_char>(&record,&local_258,true);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&sStack_278,"m_size",(allocator *)&oss);
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(&record,&sStack_278,true);
  std::__cxx11::string::~string((string *)&sStack_278);
  ki::dml::Record::read_from(&record,istream);
  this->m_service_id = pFVar1->m_value;
  this->m_type = pFVar2->m_value;
  this->m_size = (short)*(undefined4 *)&pFVar3->m_value - 4;
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void MessageHeader::read_from(std::istream& istream)
	{
		ki::dml::Record record;
		const auto *service_id = record.add_field<ki::dml::UBYT>("m_service_id");
		const auto *type = record.add_field<ki::dml::UBYT>("m_type");
		const auto size = record.add_field<ki::dml::USHRT>("m_size");

		try
		{
			record.read_from(istream);
		}
		catch (ki::dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading MessageHeader: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_HEADER_DATA);
		}

		m_service_id = service_id->get_value();
		m_type = type->get_value();
		m_size = size->get_value() - 4;
	}